

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O2

void duckdb::ForceCompressionSetting::SetGlobal(DatabaseInstance *db,DBConfig *config,Value *input)

{
  bool bVar1;
  CompressionType compression_type;
  ParserException *pPVar2;
  CompressionType type;
  allocator local_d1;
  string compression_types;
  string local_b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_90;
  string compression;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  Value::ToString_abi_cxx11_(&compression_types,input);
  StringUtil::Lower(&compression,&compression_types);
  ::std::__cxx11::string::~string((string *)&compression_types);
  bVar1 = ::std::operator==(&compression,"none");
  if (!bVar1) {
    bVar1 = ::std::operator==(&compression,"auto");
    if (!bVar1) {
      compression_type = CompressionTypeFromString(&compression);
      bVar1 = CompressionTypeIsDeprecated(compression_type);
      if (bVar1) {
        pPVar2 = (ParserException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&compression_types,
                   "Attempted to force a deprecated compression type (%s)",(allocator *)&local_b0);
        CompressionTypeToString_abi_cxx11_(&local_38,(duckdb *)(ulong)compression_type,type);
        ParserException::ParserException<std::__cxx11::string>(pPVar2,&compression_types,&local_38);
        __cxa_throw(pPVar2,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (compression_type == COMPRESSION_AUTO) {
        ListCompressionTypes_abi_cxx11_();
        ::std::__cxx11::string::string((string *)&local_b0,", ",&local_d1);
        StringUtil::Join(&compression_types,&local_90,&local_b0);
        ::std::__cxx11::string::~string((string *)&local_b0);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_90);
        pPVar2 = (ParserException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_b0,
                   "Unrecognized option for PRAGMA force_compression, expected %s",
                   (allocator *)&local_90);
        ::std::__cxx11::string::string((string *)&local_58,(string *)&compression_types);
        ParserException::ParserException<std::__cxx11::string>(pPVar2,&local_b0,&local_58);
        __cxa_throw(pPVar2,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      goto LAB_014564ac;
    }
  }
  compression_type = COMPRESSION_AUTO;
LAB_014564ac:
  (config->options).force_compression = compression_type;
  ::std::__cxx11::string::~string((string *)&compression);
  return;
}

Assistant:

void ForceCompressionSetting::SetGlobal(DatabaseInstance *db, DBConfig &config, const Value &input) {
	auto compression = StringUtil::Lower(input.ToString());
	if (compression == "none" || compression == "auto") {
		config.options.force_compression = CompressionType::COMPRESSION_AUTO;
	} else {
		auto compression_type = CompressionTypeFromString(compression);
		if (CompressionTypeIsDeprecated(compression_type)) {
			throw ParserException("Attempted to force a deprecated compression type (%s)",
			                      CompressionTypeToString(compression_type));
		}
		if (compression_type == CompressionType::COMPRESSION_AUTO) {
			auto compression_types = StringUtil::Join(ListCompressionTypes(), ", ");
			throw ParserException("Unrecognized option for PRAGMA force_compression, expected %s", compression_types);
		}
		config.options.force_compression = compression_type;
	}
}